

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::XFileImporter::CanRead(XFileImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  uint32_t token [1];
  string extension;
  undefined4 local_44;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else if (local_40._M_string_length == 0 || checkSig) {
    local_44 = 0x786f6620;
    bVar1 = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_44,1,0,4);
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool XFileImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    std::string extension = GetExtension(pFile);
    if(extension == "x") {
        return true;
    }
    if (!extension.length() || checkSig) {
        uint32_t token[1];
        token[0] = AI_MAKE_MAGIC("xof ");
        return CheckMagicToken(pIOHandler,pFile,token,1,0);
    }
    return false;
}